

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O2

char16 * NativeCodeData::GetDataDescription(void *data,JitArenaAllocator *alloc)

{
  DataChunk *pDVar1;
  size_t sVar2;
  char16_t *_Dst;
  WCHAR local_828 [4];
  char16 buf [1024];
  
  pDVar1 = GetDataChunk(data);
  memset((WCHAR (*) [1024])local_828,0,0x800);
  swprintf_s<1024ul>((WCHAR (*) [1024])local_828,
                     L"%hs, NativeCodeData: index: %x, len: %x, offset: +%x",pDVar1->dataType,
                     (ulong)pDVar1->allocIndex,(ulong)pDVar1->len,(ulong)pDVar1->offset);
  sVar2 = PAL_wcslen((char16_t *)local_828);
  _Dst = Memory::AllocateArray<Memory::JitArenaAllocator,char16_t,false>
                   ((Memory *)alloc,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,
                    sVar2 + 1);
  wcscpy_s(_Dst,sVar2 + 1,local_828);
  return _Dst;
}

Assistant:

char16*
NativeCodeData::GetDataDescription(void* data, JitArenaAllocator * alloc)
{
    auto chunk = GetDataChunk(data);
    char16 buf[1024] = { 0 };
#if DBG
    swprintf_s(buf, _u("%hs, NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->dataType, chunk->allocIndex, chunk->len, chunk->offset);
#else
    swprintf_s(buf, _u("NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->allocIndex, chunk->len, chunk->offset);
#endif
    auto len = wcslen(buf) + 1;
    auto desc = JitAnewArray(alloc, char16, len);
    wcscpy_s(desc, len, buf);
    return desc;
}